

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall
NetInterfaceSim::getString(NetInterfaceSim *this,WifiDebugOstream *log,string *input)

{
  uint __i;
  int iVar1;
  long lVar2;
  timeval local_a8;
  fd_set readfds;
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    readfds.fds_bits[lVar2] = 0;
  }
  local_a8.tv_sec = 0;
  local_a8.tv_usec = 0;
  readfds.fds_bits[0]._0_1_ = (byte)readfds.fds_bits[0] | 1;
  iVar1 = select(1,(fd_set *)&readfds,(fd_set *)0x0,(fd_set *)0x0,&local_a8);
  if (iVar1 == 0) {
    std::__cxx11::string::assign((char *)input);
  }
  else {
    std::operator>>((istream *)&std::cin,(string *)input);
  }
  return iVar1 != 0;
}

Assistant:

bool getString( WifiDebugOstream& log, std::string& input ) override
  {
    fd_set readfds;
    FD_ZERO(&readfds);

    struct timeval timeout;
    timeout.tv_sec = 0;
    timeout.tv_usec = 0;

    FD_SET(STDIN_FILENO, &readfds );
    if ( select(1, &readfds, nullptr, nullptr, &timeout ))
    {
      std::cin >> input;
      return true;
    }
    input = "";
    return false;
  }